

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O2

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,WavelengthDataBlock *wavelengthDataBlock)

{
  allocator<char> local_59;
  string local_58;
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"WavelengthDataDirection",&local_59);
  FileParse::Child<std::optional<BSDFData::WavelengthDataDirection>_>::Child
            ((Child<std::optional<BSDFData::WavelengthDataDirection>_> *)&local_38,&local_58,
             &wavelengthDataBlock->wavelengthDataDirection,0);
  FileParse::operator>>(node,(Child<std::optional<BSDFData::WavelengthDataDirection>_> *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"ColumnAngleBasis",&local_59);
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_38,&local_58,&wavelengthDataBlock->columnAngleBasis,0);
  FileParse::operator>>(node,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"RowAngleBasis",&local_59);
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_38,&local_58,&wavelengthDataBlock->rowAngleBasis,0);
  FileParse::operator>>(node,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"ScatteringDataType",&local_59);
  FileParse::Child<std::optional<BSDFData::ScatteringDataType>_>::Child
            ((Child<std::optional<BSDFData::ScatteringDataType>_> *)&local_38,&local_58,
             &wavelengthDataBlock->scatteringDataType,0);
  FileParse::operator>>(node,(Child<std::optional<BSDFData::ScatteringDataType>_> *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  operator>>(node,&wavelengthDataBlock->scatteringData);
  return node;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node,
                                   BSDFData::WavelengthDataBlock & wavelengthDataBlock)
    {
        node >> FileParse::Child{"WavelengthDataDirection",
                                 wavelengthDataBlock.wavelengthDataDirection};
        node >> FileParse::Child{"ColumnAngleBasis", wavelengthDataBlock.columnAngleBasis};
        node >> FileParse::Child{"RowAngleBasis", wavelengthDataBlock.rowAngleBasis};
        node >> FileParse::Child{"ScatteringDataType", wavelengthDataBlock.scatteringDataType};
        // Child node name is moved down to the ScatteringData serializer since compiler cannot
        // resolve between serializer of std::vector<std::vector<double>> and Child<std::vector<T>>
        // defined in FileParse
        node >> wavelengthDataBlock.scatteringData;

        return node;
    }